

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void __thiscall Assimp::DefaultLogger::~DefaultLogger(DefaultLogger *this)

{
  LogStreamInfo *this_00;
  bool bVar1;
  reference ppLVar2;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_20;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_18;
  StreamIt it;
  DefaultLogger *this_local;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__DefaultLogger_0037a150;
  it._M_current = (LogStreamInfo **)this;
  local_18._M_current =
       (LogStreamInfo **)
       std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::begin
                 (&this->m_StreamArray);
  while( true ) {
    local_20._M_current =
         (LogStreamInfo **)
         std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::end
                   (&this->m_StreamArray);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppLVar2 = __gnu_cxx::
              __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppLVar2;
    if (this_00 != (LogStreamInfo *)0x0) {
      LogStreamInfo::~LogStreamInfo(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::~vector
            (&this->m_StreamArray);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

DefaultLogger::~DefaultLogger() {
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        // also frees the underlying stream, we are its owner.
        delete *it;
    }
}